

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O3

shared_ptr<gui::RadioButtonStyle> __thiscall
gui::DefaultTheme::makeRadioButtonStyle(DefaultTheme *this)

{
  Gui *__args;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<gui::RadioButtonStyle> sVar1;
  undefined1 local_29;
  Vector3f local_28;
  
  __args = *(Gui **)(in_RSI + 8);
  (this->super_Theme)._vptr_Theme = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<gui::RadioButtonStyle,std::allocator<gui::RadioButtonStyle>,gui::Gui_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->super_Theme).gui_,
             (RadioButtonStyle **)this,(allocator<gui::RadioButtonStyle> *)&local_29,__args);
  CheckBoxStyle::setFillColor
            ((CheckBoxStyle *)(this->super_Theme)._vptr_Theme,(Color *)&sf::Color::White);
  CheckBoxStyle::setOutlineColor
            ((CheckBoxStyle *)(this->super_Theme)._vptr_Theme,(Color *)&sf::Color::Black);
  CheckBoxStyle::setOutlineThickness((CheckBoxStyle *)(this->super_Theme)._vptr_Theme,-1.0);
  CheckBoxStyle::setFont((CheckBoxStyle *)(this->super_Theme)._vptr_Theme,*(Font **)(in_RSI + 0x48))
  ;
  CheckBoxStyle::setCharacterSize((CheckBoxStyle *)(this->super_Theme)._vptr_Theme,0xf);
  CheckBoxStyle::setTextFillColor
            ((CheckBoxStyle *)(this->super_Theme)._vptr_Theme,(Color *)&sf::Color::Black);
  CheckBoxStyle::setFillColorHover
            ((CheckBoxStyle *)(this->super_Theme)._vptr_Theme,
             (Color *)&(anonymous_namespace)::colorLightBlueTransparent);
  CheckBoxStyle::setFillColorChecked
            ((CheckBoxStyle *)(this->super_Theme)._vptr_Theme,
             (Color *)&(anonymous_namespace)::colorDarkBlue);
  local_28.z = *(float *)(in_RSI + 0x50);
  local_28.x = 8.0;
  local_28.y = 1.0;
  CheckBoxStyle::setTextPadding((CheckBoxStyle *)(this->super_Theme)._vptr_Theme,&local_28);
  RadioButtonStyle::setDiamond((RadioButtonStyle *)(this->super_Theme)._vptr_Theme,true);
  sVar1.super___shared_ptr<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<gui::RadioButtonStyle>)
         sVar1.super___shared_ptr<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<RadioButtonStyle> DefaultTheme::makeRadioButtonStyle() const {
    auto style = std::make_shared<RadioButtonStyle>(gui_);
    style->setFillColor(sf::Color::White);
    style->setOutlineColor(sf::Color::Black);
    style->setOutlineThickness(-1.0f);

    style->setFont(*font_);
    style->setCharacterSize(15);
    style->setTextFillColor(sf::Color::Black);

    style->setFillColorHover(colorLightBlueTransparent);
    style->setFillColorChecked(colorDarkBlue);
    style->setTextPadding({8.0f, 1.0f, fontMaxHeightRatio_});

    style->setDiamond(true);

    return style;
}